

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleDropEvent(QWidgetWindow *this,QDropEvent *event)

{
  QPointer<QWidget> *this_00;
  Data *pDVar1;
  bool bVar2;
  QPoint QVar3;
  QWidget *this_01;
  QWidget *this_02;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QPoint local_98;
  double local_90;
  QPointF local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  char *pcStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QPoint local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_dragTarget;
  bVar2 = QWeakPointer<QObject>::isNull(&this_00->wp);
  if (bVar2) {
    local_88.xp._0_4_ = 2;
    uStack_74 = 0;
    local_88.xp._4_4_ = 0;
    local_88.yp._0_4_ = 0;
    local_88.yp._4_4_ = 0;
    local_78 = 0;
    pcStack_70 = "default";
    QMessageLogger::warning();
    ::operator<<((Stream *)&local_98,(QWidget *)(local_48 + 1));
    QDebug::operator<<((QDebug *)&local_98,": No drag target set.");
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)(local_48 + 1));
    event[0xc] = (QDropEvent)0x0;
  }
  else {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      this_02 = (QWidget *)0x0;
    }
    else {
      this_02 = (QWidget *)(this->m_dragTarget).wp.value;
    }
    pDVar1 = (this->m_widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      this_01 = (QWidget *)0x0;
    }
    else {
      this_01 = (QWidget *)(this->m_widget).wp.value;
    }
    local_88.xp._0_4_ = (undefined4)*(undefined8 *)(event + 0x10);
    local_88.xp._4_4_ = (undefined4)((ulong)*(undefined8 *)(event + 0x10) >> 0x20);
    local_88.yp._0_4_ = (undefined4)*(undefined8 *)(event + 0x18);
    local_88.yp._4_4_ = (undefined4)((ulong)*(undefined8 *)(event + 0x18) >> 0x20);
    local_48[0] = QPointF::toPoint(&local_88);
    local_98 = QWidget::mapToGlobal(this_01,local_48);
    QVar3 = QWidget::mapFromGlobal(this_02,&local_98);
    local_88.xp._0_4_ = 0xaaaaaaaa;
    local_88.xp._4_4_ = 0xaaaaaaaa;
    local_88.yp._0_4_ = 0xaaaaaaaa;
    local_88.yp._4_4_ = 0xaaaaaaaa;
    local_78 = 0xffffffff;
    uStack_74 = 0xffffffff;
    pcStack_70 = (char *)0xffffffffffffffff;
    local_98 = (QPoint)(double)QVar3.xp.m_i.m_i;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = (double)QVar3.yp.m_i.m_i;
    QDropEvent::QDropEvent
              ((QDropEvent *)&local_88,&local_98,*(undefined4 *)(event + 0x28),
               *(undefined8 *)(event + 0x38),*(undefined4 *)(event + 0x20),
               *(undefined4 *)(event + 0x24),0x3f);
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->m_dragTarget).wp.value;
    }
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
    QCoreApplication::forwardEvent(pQVar4,(QEvent *)&local_88,(QEvent *)event);
    (**(code **)(*(long *)event + 0x10))(event,local_88.yp._4_1_);
    QDropEvent::setDropAction((DropAction)event);
    QDropEvent::~QDropEvent((QDropEvent *)&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleDropEvent(QDropEvent *event)
{
    if (Q_UNLIKELY(m_dragTarget.isNull())) {
        qWarning() << m_widget << ": No drag target set.";
        event->ignore();
        return;
    }
    const QPoint mapped = m_dragTarget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDropEvent translated(mapped, event->possibleActions(), event->mimeData(), event->buttons(), event->modifiers());
    QWidget *dragTarget = m_dragTarget;
    m_dragTarget = nullptr;
    QGuiApplication::forwardEvent(dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}